

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O3

int OpenMD::findBegin(istream *theStream,char *startText)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  char readLine [1024];
  char acStack_438 [1032];
  
  std::istream::seekg((long)theStream,_S_beg);
  if (((&theStream->field_0x20)[(long)theStream->_vptr_basic_istream[-3]] & 2) == 0) {
    std::ios::widen((char)theStream->_vptr_basic_istream[-3] + (char)theStream);
    std::istream::getline((char *)theStream,(long)acStack_438,'\0');
    uVar4 = 1;
    bVar1 = (&theStream->field_0x20)[(long)theStream->_vptr_basic_istream[-3]];
    while ((bVar1 & 2) == 0) {
      pcVar3 = strtok(acStack_438," ,;\t");
      if ((((pcVar3 != (char *)0x0) && (iVar2 = strcasecmp("begin",pcVar3), iVar2 == 0)) &&
          (pcVar3 = strtok((char *)0x0," ,;\t"), pcVar3 != (char *)0x0)) &&
         (iVar2 = strcasecmp(startText,pcVar3), iVar2 == 0)) {
        return uVar4;
      }
      if (((&theStream->field_0x20)[(long)theStream->_vptr_basic_istream[-3]] & 2) != 0) break;
      std::ios::widen((char)theStream->_vptr_basic_istream[-3] + (char)theStream);
      std::istream::getline((char *)theStream,(long)acStack_438,'\0');
      uVar4 = uVar4 + 1;
      bVar1 = (&theStream->field_0x20)[(long)theStream->_vptr_basic_istream[-3]];
    }
    printf("Error fast forwarding stream at line %d: stream ended unexpectedly.\n",(ulong)uVar4);
  }
  else {
    puts("Error fast forwarding stream: stream is empty.");
  }
  return -1;
}

Assistant:

int findBegin(std::istream& theStream, const char* startText) {
    const int MAXLEN = 1024;
    char readLine[MAXLEN];
    int foundText = 0;
    int lineNum;
    char* the_token;

    // rewind the stream
    theStream.seekg(0, std::ios::beg);
    lineNum = 0;

    if (!theStream.eof()) {
      theStream.getline(readLine, MAXLEN);
      lineNum++;
    } else {
      printf("Error fast forwarding stream: stream is empty.\n");
      return -1;
    }

    while (!foundText) {
      if (theStream.eof()) {
        printf("Error fast forwarding stream at line %d: "
               "stream ended unexpectedly.\n",
               lineNum);
        return -1;
      }

      the_token = strtok(readLine, " ,;\t");
      if (the_token != NULL)
        if (!strcasecmp("begin", the_token)) {
          the_token = strtok(NULL, " ,;\t");
          if (the_token != NULL) {
            foundText = !strcasecmp(startText, the_token);
          }
        }

      if (!foundText) {
        if (!theStream.eof()) {
          theStream.getline(readLine, MAXLEN);
          lineNum++;
        } else {
          printf("Error fast forwarding stream at line %d: "
                 "stream ended unexpectedly.\n",
                 lineNum);
          return -1;
        }
      }
    }
    return lineNum;
  }